

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr local_18;
  
  pSVar3 = stack_get(v,idx);
  SVar2 = (pSVar3->super_SQObject)._type;
  if ((SVar2 == OT_USERDATA) || (SVar2 == OT_TABLE)) {
    local_18.super_SQObject._unVal = (SQObjectValue)((pSVar3->super_SQObject)._unVal.pClosure)->_env
    ;
    if (local_18.super_SQObject._unVal.pTable == (SQTable *)0x0) {
      SQVM::PushNull(v);
    }
    else {
      local_18.super_SQObject._type = OT_TABLE;
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(v,&local_18);
      SQObjectPtr::~SQObjectPtr(&local_18);
    }
    SVar4 = 0;
  }
  else {
    sq_throwerror(v,"wrong type");
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(sq_type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        if(!_delegable(self)->_delegate){
            v->PushNull();
            break;
        }
        v->Push(SQObjectPtr(_delegable(self)->_delegate));
        break;
    default: return sq_throwerror(v,_SC("wrong type")); break;
    }
    return SQ_OK;

}